

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O1

uint16_t __thiscall kaitai::kstream::read_u2le(kstream *this)

{
  uint16_t t;
  uint16_t local_a;
  
  std::istream::read((char *)this->m_io,(long)&local_a);
  return local_a;
}

Assistant:

uint16_t kaitai::kstream::read_u2le() {
    uint16_t t;
    m_io->read(reinterpret_cast<char *>(&t), 2);
#if __BYTE_ORDER == __BIG_ENDIAN
    t = bswap_16(t);
#endif
    return t;
}